

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Symbol * slang::ast::selectChildRange
                   (InstanceArraySymbol *array,RangeSelectSyntax *syntax,ASTContext *context,
                   LookupResult *result)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  bool bVar1;
  bool bVar2;
  bitwidth_t bVar3;
  int32_t iVar4;
  int32_t iVar5;
  int *piVar6;
  Scope *this;
  ConstantRange *pCVar7;
  SourceLocation SVar8;
  InstanceArraySymbol *args;
  pair<int,_int> *args_1;
  SourceLocation in_RCX;
  int *in_RSI;
  long in_RDI;
  optional<slang::ConstantRange> oVar9;
  InstanceArraySymbol *children;
  Compilation *comp;
  ConstantRange newRange;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> elems;
  int32_t end;
  int32_t begin;
  Diagnostic *diag_1;
  optional<slang::ConstantRange> range;
  Diagnostic *diag;
  ConstantRange selRange;
  optional<int> right;
  optional<int> left;
  ConstantRange *in_stack_fffffffffffffe18;
  size_type in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  int iVar10;
  Diagnostic *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int32_t iVar11;
  undefined4 in_stack_fffffffffffffe3c;
  SourceLocation in_stack_fffffffffffffe40;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe48;
  SyntaxNode *in_stack_fffffffffffffe50;
  DiagCode DVar12;
  ConstantRange *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  SourceLocation *in_stack_fffffffffffffe68;
  SyntaxNode *in_stack_fffffffffffffe70;
  Compilation *in_stack_fffffffffffffe78;
  BumpAllocator *in_stack_fffffffffffffe80;
  pair<int,_int> local_150;
  Token local_148;
  SourceLocation local_138;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  InstanceArraySymbol *local_120;
  Compilation *local_118;
  ConstantRange local_110;
  ConstantRange local_108;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_100;
  int local_f0;
  int local_ec;
  SourceRange local_e8;
  undefined4 local_d4;
  Diagnostic *local_d0;
  SourceRange local_c8;
  undefined4 local_b4;
  _Storage<slang::ConstantRange,_true> local_b0;
  undefined4 local_a8;
  _Storage<slang::ConstantRange,_true> local_9c;
  undefined4 local_94;
  SourceRange local_90;
  undefined4 local_7c;
  SourceRange local_78;
  undefined4 local_64;
  Diagnostic *local_60;
  ConstantRange local_58;
  ConstantRange local_50;
  bitmask<slang::ast::ASTFlags> local_48;
  _Optional_payload_base<int> local_40;
  bitmask<slang::ast::ASTFlags> local_38;
  _Optional_payload_base<int> local_30;
  SourceLocation local_28;
  int *local_18;
  long local_10;
  InstanceArraySymbol *local_8;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)0x717268);
  if (bVar1) {
    local_8 = (InstanceArraySymbol *)0x0;
  }
  else {
    not_null<slang::syntax::ExpressionSyntax_*>::operator*
              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x71729d);
    memset(&local_38,0,8);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_38);
    local_30 = (_Optional_payload_base<int>)
               ASTContext::evalInteger
                         ((ASTContext *)in_stack_fffffffffffffe40,
                          (ExpressionSyntax *)
                          CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          in_stack_fffffffffffffe48);
    not_null<slang::syntax::ExpressionSyntax_*>::operator*
              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x717309);
    memset(&local_48,0,8);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_48);
    local_40 = (_Optional_payload_base<int>)
               ASTContext::evalInteger
                         ((ASTContext *)in_stack_fffffffffffffe40,
                          (ExpressionSyntax *)
                          CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          in_stack_fffffffffffffe48);
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x717364);
    if ((bVar1) && (bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x717377), bVar1))
    {
      ConstantRange::ConstantRange(&local_50);
      if (*local_18 == 0x1b0) {
        piVar6 = std::optional<int>::operator*((optional<int> *)0x7173ba);
        iVar11 = *piVar6;
        piVar6 = std::optional<int>::operator*((optional<int> *)0x7173cd);
        ConstantRange::ConstantRange(&local_58,iVar11,*piVar6);
        local_50 = local_58;
        bVar1 = ConstantRange::isLittleEndian(&local_50);
        bVar2 = ConstantRange::isLittleEndian((ConstantRange *)(local_10 + 0x88));
        if ((bVar1 != bVar2) && (bVar3 = ConstantRange::width((ConstantRange *)0x71743b), 1 < bVar3)
           ) {
          not_null<const_slang::ast::Scope_*>::operator*
                    ((not_null<const_slang::ast::Scope_*> *)0x71745e);
          iVar10 = (int)(in_stack_fffffffffffffe28 >> 0x20);
          DVar12 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
          local_64 = 0x11000a;
          local_78 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffe70);
          sourceRange.endLoc = (SourceLocation)in_stack_fffffffffffffe48.m_bits;
          sourceRange.startLoc = in_stack_fffffffffffffe40;
          local_60 = LookupResult::addDiag
                               ((LookupResult *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                (Scope *)in_stack_fffffffffffffe30,DVar12,sourceRange);
          Diagnostic::operator<<<int>(in_stack_fffffffffffffe30,iVar10);
          Diagnostic::operator<<<int>(in_stack_fffffffffffffe30,iVar10);
          Diagnostic::operator<<<int>(in_stack_fffffffffffffe30,iVar10);
          Diagnostic::operator<<<int>(in_stack_fffffffffffffe30,iVar10);
          return (Symbol *)0x0;
        }
      }
      else {
        piVar6 = std::optional<int>::operator*((optional<int> *)0x717532);
        if (*piVar6 < 1) {
          this = not_null<const_slang::ast::Scope_*>::operator*
                           ((not_null<const_slang::ast::Scope_*> *)0x717555);
          DVar12 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
          local_7c = 0x80003;
          not_null<slang::syntax::ExpressionSyntax_*>::operator->
                    ((not_null<slang::syntax::ExpressionSyntax_*> *)0x717578);
          local_90 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
          sourceRange_00.endLoc = (SourceLocation)in_stack_fffffffffffffe48.m_bits;
          sourceRange_00.startLoc = in_stack_fffffffffffffe40;
          LookupResult::addDiag
                    ((LookupResult *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (Scope *)in_stack_fffffffffffffe30,DVar12,sourceRange_00);
          return (Symbol *)0x0;
        }
        piVar6 = std::optional<int>::operator*((optional<int> *)0x7175d4);
        in_stack_fffffffffffffe60 = *piVar6;
        piVar6 = std::optional<int>::operator*((optional<int> *)0x7175e7);
        in_stack_fffffffffffffe64 = *piVar6;
        ConstantRange::isLittleEndian((ConstantRange *)(local_10 + 0x88));
        oVar9 = ConstantRange::getIndexedRange
                          ((int32_t)in_stack_fffffffffffffe58,
                           (int32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffe50 >> 0x18,0),
                           SUB81((ulong)in_stack_fffffffffffffe50 >> 0x10,0));
        local_b0 = oVar9.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::ConstantRange>._M_payload;
        local_a8 = CONCAT31(local_a8._1_3_,
                            oVar9.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                            super__Optional_payload_base<slang::ConstantRange>._M_engaged);
        local_94 = local_a8;
        local_9c = local_b0;
        bVar1 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0x717660);
        if (!bVar1) {
          not_null<const_slang::ast::Scope_*>::operator*
                    ((not_null<const_slang::ast::Scope_*> *)0x717682);
          DVar12 = local_28._4_4_;
          local_b4 = 0x8b0007;
          local_c8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffe70);
          sourceRange_01.endLoc = (SourceLocation)in_stack_fffffffffffffe48.m_bits;
          sourceRange_01.startLoc = in_stack_fffffffffffffe40;
          LookupResult::addDiag
                    ((LookupResult *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (Scope *)in_stack_fffffffffffffe30,DVar12,sourceRange_01);
          return (Symbol *)0x0;
        }
        pCVar7 = std::optional<slang::ConstantRange>::operator*
                           ((optional<slang::ConstantRange> *)0x7176f5);
        local_50 = *pCVar7;
      }
      bVar1 = ConstantRange::containsPoint
                        ((ConstantRange *)in_stack_fffffffffffffe30,
                         (int32_t)(in_stack_fffffffffffffe28 >> 0x20));
      if ((bVar1) &&
         (bVar1 = ConstantRange::containsPoint
                            ((ConstantRange *)in_stack_fffffffffffffe30,
                             (int32_t)(in_stack_fffffffffffffe28 >> 0x20)), bVar1)) {
        iVar11 = local_50.left;
        iVar4 = ConstantRange::lower((ConstantRange *)0x71783f);
        local_ec = iVar11 - iVar4;
        iVar4 = local_50.right;
        iVar5 = ConstantRange::lower((ConstantRange *)0x71786d);
        local_f0 = iVar4 - iVar5;
        if (local_f0 < local_ec) {
          std::swap<int>(&local_ec,&local_f0);
        }
        local_100 = std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::subspan
                              ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                               in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                               in_stack_fffffffffffffe20);
        bVar3 = ConstantRange::width((ConstantRange *)0x7178ec);
        ConstantRange::ConstantRange(&local_108,bVar3 - 1,0);
        bVar1 = ConstantRange::isLittleEndian(&local_50);
        if (!bVar1) {
          local_110 = ConstantRange::reverse(in_stack_fffffffffffffe18);
          local_108 = local_110;
        }
        local_118 = ASTContext::getCompilation((ASTContext *)0x717943);
        local_130 = sv((char *)local_118,(size_t)local_118);
        local_148 = slang::syntax::SyntaxNode::getFirstToken(in_stack_fffffffffffffe50);
        local_138 = parsing::Token::location(&local_148);
        args = BumpAllocator::
               emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*const,18446744073709551615ul>&,slang::ConstantRange&>
                         (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                          (basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                          (span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe58);
        args_1 = (pair<int,_int> *)((long)local_28 + 0xf0);
        local_120 = args;
        std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_150,&local_ec,&local_f0);
        SmallVectorBase<slang::ast::HierarchicalReference::Element>::
        emplace_back<slang::ast::InstanceArraySymbol&,std::pair<int,int>>
                  ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
                   CONCAT44(iVar4,iVar11),args,args_1);
        local_8 = local_120;
      }
      else {
        iVar10 = (int)(in_stack_fffffffffffffe28 >> 0x20);
        DVar12 = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
        SVar8 = (SourceLocation)
                not_null<const_slang::ast::Scope_*>::operator*
                          ((not_null<const_slang::ast::Scope_*> *)0x71775e);
        local_d4 = 0x2000a;
        local_e8 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffe70);
        sourceRange_02.endLoc = SVar8;
        sourceRange_02.startLoc = local_28;
        local_d0 = LookupResult::addDiag
                             ((LookupResult *)
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                              (Scope *)in_stack_fffffffffffffe30,DVar12,sourceRange_02);
        Diagnostic::operator<<<int>(in_stack_fffffffffffffe30,iVar10);
        Diagnostic::operator<<<int>(in_stack_fffffffffffffe30,iVar10);
        Diagnostic::operator<<<int>(in_stack_fffffffffffffe30,iVar10);
        Diagnostic::operator<<<int>(in_stack_fffffffffffffe30,iVar10);
        local_8 = (InstanceArraySymbol *)0x0;
      }
    }
    else {
      local_8 = (InstanceArraySymbol *)0x0;
    }
  }
  return &local_8->super_Symbol;
}

Assistant:

static const Symbol* selectChildRange(const InstanceArraySymbol& array,
                                      const RangeSelectSyntax& syntax, const ASTContext& context,
                                      LookupResult& result) {
    if (array.elements.empty())
        return nullptr;

    // Evaluate both sides of the range.
    auto left = context.evalInteger(*syntax.left);
    auto right = context.evalInteger(*syntax.right);
    if (!left || !right)
        return nullptr;

    ConstantRange selRange;
    if (syntax.kind == SyntaxKind::SimpleRangeSelect) {
        selRange = {*left, *right};
        if (selRange.isLittleEndian() != array.range.isLittleEndian() && selRange.width() > 1) {
            auto& diag = result.addDiag(*context.scope, diag::InstanceArrayEndianMismatch,
                                        syntax.sourceRange());
            diag << selRange.left << selRange.right;
            diag << array.range.left << array.range.right;
            return nullptr;
        }
    }
    else {
        if (*right <= 0) {
            result.addDiag(*context.scope, diag::ValueMustBePositive, syntax.right->sourceRange());
            return nullptr;
        }

        auto range = ConstantRange::getIndexedRange(*left, *right, array.range.isLittleEndian(),
                                                    syntax.kind ==
                                                        SyntaxKind::AscendingRangeSelect);
        if (!range) {
            result.addDiag(*context.scope, diag::RangeWidthOverflow, syntax.sourceRange());
            return nullptr;
        }

        selRange = *range;
    }

    if (!array.range.containsPoint(selRange.left) || !array.range.containsPoint(selRange.right)) {
        auto& diag = result.addDiag(*context.scope, diag::BadInstanceArrayRange,
                                    syntax.sourceRange());
        diag << selRange.left << selRange.right;
        diag << array.range.left << array.range.right;
        return nullptr;
    }

    int32_t begin = selRange.left - array.range.lower();
    int32_t end = selRange.right - array.range.lower();
    if (begin > end)
        std::swap(begin, end);

    auto elems = array.elements.subspan(size_t(begin), size_t(end - begin) + 1);

    ConstantRange newRange{int32_t(selRange.width()) - 1, 0};
    if (!selRange.isLittleEndian())
        newRange = newRange.reverse();

    // Create a placeholder array symbol that will hold this new sliced array.
    auto& comp = context.getCompilation();
    auto children = comp.emplace<InstanceArraySymbol>(comp, ""sv, syntax.getFirstToken().location(),
                                                      elems, newRange);
    result.path.emplace_back(*children, std::pair(begin, end));
    return children;
}